

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result_reporter.hpp
# Opt level: O0

void __thiscall
iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
Collector(Collector<iutest::detail::NoTestPartResultReporter> *this)

{
  Collector<iutest::detail::NoTestPartResultReporter> *this_local;
  
  NoTestPartResultReporter::NoTestPartResultReporter(&this->super_NoTestPartResultReporter);
  (this->super_NoTestPartResultReporter).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface = (_func_int **)&PTR__Collector_00171350;
  ReporterHolder::ReporterHolder(&this->m_holder);
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::vector
            (&this->m_results);
  ReporterHolder::Attach(&this->m_holder,(TestPartResultReporterInterface *)this);
  return;
}

Assistant:

Collector()
        {
            m_holder.Attach(this);
        }